

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O3

void __thiscall OpenMD::NPTf::evolveEtaB(NPTf *this)

{
  double dVar1;
  Mat3x3d *pMVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  pMVar2 = &this->prevEta;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      (pMVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar4] =
           pMVar2[-2].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar4]
      ;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    pMVar2 = (Mat3x3d *)
             ((pMVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar3 != 3);
  dVar5 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 *
          (this->super_NPT).instaVol;
  dVar6 = (this->super_NPT).NkBT * (this->super_NPT).tb2;
  dVar1 = (this->super_NPT).targetPressure;
  lVar3 = 0;
  pMVar2 = &this->oldEta;
  do {
    lVar4 = 0;
    do {
      if (lVar3 == lVar4) {
        *(double *)
         ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
         lVar3 * 0x20) =
             ((*(double *)
                ((long)(this->super_NPT).press.super_SquareMatrix<double,_3>.
                       super_RectMatrix<double,_3U,_3U>.data_ + lVar3 * 0x20) - dVar1 / 163882576.0)
             * dVar5) / dVar6 +
             *(double *)
              ((long)(this->oldEta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                     data_ + lVar3 * 0x20);
      }
      else {
        pMVar2[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar4] =
             (*(double *)((long)pMVar2 + lVar4 * 8 + -0xa0) * dVar5) / dVar6 +
             (pMVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
             [lVar4];
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar3 = lVar3 + 1;
    pMVar2 = (Mat3x3d *)
             ((pMVar2->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar3 != 3);
  return;
}

Assistant:

void NPTf::evolveEtaB() {
    int i;
    int j;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        prevEta(i, j) = eta(i, j);
      }
    }

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        if (i == j) {
          eta(i, j) =
              oldEta(i, j) +
              dt2 * instaVol *
                  (press(i, j) - targetPressure / Constants::pressureConvert) /
                  (NkBT * tb2);
        } else {
          eta(i, j) =
              oldEta(i, j) + dt2 * instaVol * press(i, j) / (NkBT * tb2);
        }
      }
    }
  }